

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void maybe_resize(uv_loop_t *loop,uint len)

{
  uint uVar1;
  uint uVar2;
  uv__io_t **ppuVar3;
  uint local_38;
  uint i;
  uint nwatchers;
  void *fake_watcher_count;
  void *fake_watcher_list;
  uv__io_t **watchers;
  uint len_local;
  uv_loop_t *loop_local;
  
  if (loop->nwatchers < len) {
    if (loop->watchers == (uv__io_t **)0x0) {
      fake_watcher_count = (void *)0x0;
      _i = (uv__io_t *)0x0;
    }
    else {
      fake_watcher_count = loop->watchers[loop->nwatchers];
      _i = loop->watchers[loop->nwatchers + 1];
    }
    uVar1 = next_power_of_two(len + 2);
    uVar2 = uVar1 - 2;
    ppuVar3 = (uv__io_t **)uv__reallocf(loop->watchers,(ulong)uVar1 << 3);
    if (ppuVar3 == (uv__io_t **)0x0) {
      abort();
    }
    for (local_38 = loop->nwatchers; local_38 < uVar2; local_38 = local_38 + 1) {
      ppuVar3[local_38] = (uv__io_t *)0x0;
    }
    ppuVar3[uVar2] = (uv__io_t *)fake_watcher_count;
    ppuVar3[uVar1 - 1] = _i;
    loop->watchers = ppuVar3;
    loop->nwatchers = uVar2;
  }
  return;
}

Assistant:

static void maybe_resize(uv_loop_t* loop, unsigned int len) {
  uv__io_t** watchers;
  void* fake_watcher_list;
  void* fake_watcher_count;
  unsigned int nwatchers;
  unsigned int i;

  if (len <= loop->nwatchers)
    return;

  /* Preserve fake watcher list and count at the end of the watchers */
  if (loop->watchers != NULL) {
    fake_watcher_list = loop->watchers[loop->nwatchers];
    fake_watcher_count = loop->watchers[loop->nwatchers + 1];
  } else {
    fake_watcher_list = NULL;
    fake_watcher_count = NULL;
  }

  nwatchers = next_power_of_two(len + 2) - 2;
  watchers = uv__reallocf(loop->watchers,
                          (nwatchers + 2) * sizeof(loop->watchers[0]));

  if (watchers == NULL)
    abort();
  for (i = loop->nwatchers; i < nwatchers; i++)
    watchers[i] = NULL;
  watchers[nwatchers] = fake_watcher_list;
  watchers[nwatchers + 1] = fake_watcher_count;

  loop->watchers = watchers;
  loop->nwatchers = nwatchers;
}